

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProxyLine.cpp
# Opt level: O0

void __thiscall ProxyLine::onClosed(ProxyLine *this)

{
  ICallback *pIVar1;
  String local_38;
  ProxyLine *local_10;
  ProxyLine *this_local;
  
  pIVar1 = this->_callback;
  local_10 = this;
  String::String<23ul>(&local_38,(char (*) [23])"Closed by proxy server");
  (*pIVar1->_vptr_ICallback[1])(pIVar1,this,&local_38);
  String::~String(&local_38);
  return;
}

Assistant:

void ProxyLine::onClosed()
{
    _callback.onClosed(*this, "Closed by proxy server");
}